

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O3

void __thiscall
random_tests::xoroshiro128plusplus_reference_values::test_method
          (xoroshiro128plusplus_reference_values *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar3;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  lazy_ostream local_a0;
  undefined1 *local_90;
  char **local_88;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  local_80;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xf6;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_80.m_lhs.m_value = 0x6f68e1e7e2646ee1;
  local_80.m_rhs = 0x6f68e1e7e2646ee1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_70,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_80,false);
  local_b0 = "0x6f68e1e7e2646ee1 == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_b8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_c0,0xf6);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xf7;
  file_00.m_begin = (iterator)&local_d0;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e0,msg_00
            );
  local_80.m_lhs.m_value = 0xbf971b7f454094ad;
  local_80.m_rhs = 0xbf971b7f454094ad;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_70,&local_80,false);
  local_b0 = "0xbf971b7f454094ad == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_e8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_f0,0xf7);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xf8;
  file_01.m_begin = (iterator)&local_100;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_110,
             msg_01);
  local_80.m_lhs.m_value = 0x48f2de556f30de38;
  local_80.m_rhs = 0x48f2de556f30de38;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_70,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_80,false);
  local_b0 = "0x48f2de556f30de38 == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_118 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_120,0xf8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xf9;
  file_02.m_begin = (iterator)&local_130;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_140,
             msg_02);
  local_80.m_lhs.m_value = 0x6ea7c59f89bbfc75;
  local_80.m_rhs = 0x6ea7c59f89bbfc75;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_70,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_80,false);
  local_b0 = "0x6ea7c59f89bbfc75 == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_148 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_150,0xf9);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xfd;
  file_03.m_begin = (iterator)&local_160;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_170,
             msg_03);
  local_80.m_lhs.m_value = 0xc8dc5e08d844ac7d;
  local_80.m_rhs = 0xc8dc5e08d844ac7d;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_70,&local_80,false);
  local_b0 = "0xc8dc5e08d844ac7d == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_178 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_180,0xfd);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xfe;
  file_04.m_begin = (iterator)&local_190;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a0,
             msg_04);
  local_80.m_lhs.m_value = 0x5b5f1f6d499dad1b;
  local_80.m_rhs = 0x5b5f1f6d499dad1b;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_70,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_80,false);
  local_b0 = "0x5b5f1f6d499dad1b == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1a8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_1b0,0xfe);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xff;
  file_05.m_begin = (iterator)&local_1c0;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d0,
             msg_05);
  local_80.m_lhs.m_value = 0xbeb0031f93313d6f;
  local_80.m_rhs = 0xbeb0031f93313d6f;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_70,&local_80,false);
  local_b0 = "0xbeb0031f93313d6f == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1d8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0xe;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,_cVar3,(size_t)&local_1e0,0xff);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x100;
  file_06.m_begin = (iterator)&local_1f0;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_200,
             msg_06);
  local_80.m_lhs.m_value = 0xbfbcf4f43a264497;
  local_80.m_rhs = 0xbfbcf4f43a264497;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_70,&local_80,false);
  local_b0 = "0xbfbcf4f43a264497 == rng()";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_a0,1,0xe,WARN,0xec2328,(size_t)&stack0xfffffffffffffdf0,0x100);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xoroshiro128plusplus_reference_values)
{
    // numbers generated from reference implementation
    InsecureRandomContext rng(0);
    BOOST_TEST(0x6f68e1e7e2646ee1 == rng());
    BOOST_TEST(0xbf971b7f454094ad == rng());
    BOOST_TEST(0x48f2de556f30de38 == rng());
    BOOST_TEST(0x6ea7c59f89bbfc75 == rng());

    // seed with a random number
    rng.Reseed(0x1a26f3fa8546b47a);
    BOOST_TEST(0xc8dc5e08d844ac7d == rng());
    BOOST_TEST(0x5b5f1f6d499dad1b == rng());
    BOOST_TEST(0xbeb0031f93313d6f == rng());
    BOOST_TEST(0xbfbcf4f43a264497 == rng());
}